

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

void * __thiscall
DebugDirEntryWrapper::getFieldPtr(DebugDirEntryWrapper *this,size_t fId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  IMAGE_DEBUG_DIRECTORY *d;
  size_t subField_local;
  size_t fId_local;
  DebugDirEntryWrapper *this_local;
  
  this_local = (DebugDirEntryWrapper *)debugDir(this);
  if (this_local == (DebugDirEntryWrapper *)0x0) {
    this_local = (DebugDirEntryWrapper *)0x0;
  }
  else {
    switch(fId) {
    case 0:
      break;
    case 1:
      this_local = (DebugDirEntryWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.
                           super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer
                   + 4);
      break;
    case 2:
      this_local = (DebugDirEntryWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                    m_Exe;
      break;
    case 3:
      this_local = (DebugDirEntryWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.
                           super_ExeElementWrapper.m_Exe + 2);
      break;
    case 4:
      this_local = (DebugDirEntryWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.
                           super_ExeElementWrapper.m_Exe + 4);
      break;
    case 5:
      this_local = (DebugDirEntryWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.parentNode;
      break;
    case 6:
      this_local = (DebugDirEntryWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.parentNode + 4);
      break;
    case 7:
      this_local = (DebugDirEntryWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.entryNum;
      break;
    default:
      iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
      this_local = (DebugDirEntryWrapper *)CONCAT44(extraout_var,iVar1);
    }
  }
  return this_local;
}

Assistant:

void* DebugDirEntryWrapper::getFieldPtr(size_t fId, size_t subField)
{
    IMAGE_DEBUG_DIRECTORY* d = debugDir();
    if (d == NULL) return NULL;

    switch (fId) {
        case CHARACTERISTIC: return &d->Characteristics;
        case TIMESTAMP: return &d->TimeDateStamp;
        case MAJOR_VER: return &d->MajorVersion;
        case MINOR_VER: return &d->MinorVersion;
        case TYPE: return &d->Type;
        case DATA_SIZE: return &d->SizeOfData;
        case RAW_DATA_ADDR: return &d->AddressOfRawData;
        case RAW_DATA_PTR: return &d->PointerToRawData;
    }
    return this->getPtr();
}